

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark_relax.c
# Opt level: O1

int mark_relax(int n,int *relax_end,int *relax_fsupc,int_t *xa_begin,int_t *xa_end,int_t *asub,
              int *marker)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if (n < 1) {
    return 0;
  }
  uVar4 = 0;
  do {
    iVar1 = relax_fsupc[uVar4];
    lVar3 = (long)iVar1;
    if (lVar3 == -1) {
      return (int)uVar4;
    }
    iVar2 = relax_end[lVar3];
    if (iVar1 <= iVar2) {
      do {
        lVar5 = (long)xa_begin[lVar3];
        if (xa_begin[lVar3] < xa_end[lVar3]) {
          do {
            marker[asub[lVar5]] = iVar1;
            lVar5 = lVar5 + 1;
          } while (lVar5 < xa_end[lVar3]);
        }
        lVar3 = lVar3 + 1;
      } while (iVar2 + 1 != (int)lVar3);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != (uint)n);
  return n;
}

Assistant:

int mark_relax(
	int n,		    /* order of the matrix A */
	const int *relax_end,     /* last column in a relaxed supernode.
			     * if j-th column starts a relaxed supernode,
			     * relax_end[j] represents the last column of
			     * this supernode. */
	const int *relax_fsupc,   /* first column in a relaxed supernode.
			     * relax_fsupc[j] represents the first column of
			     * j-th supernode. */
	const int_t *xa_begin,    /* Astore->colbeg */
	const int_t *xa_end,	    /* Astore->colend */
	const int_t *asub,	    /* row index of A */
	int   *marker	    /* marker[j] is the maximum column index if j-th
			     * row belongs to a relaxed supernode. */ )
{
    register int jcol, kcol;
    register int_t i, j;
    int_t k;

    for (i = 0; i < n && relax_fsupc[i] != SLU_EMPTY; i++)
    {
	jcol = relax_fsupc[i];	/* first column */
	kcol = relax_end[jcol]; /* last column */
	for (j = jcol; j <= kcol; j++)
	    for (k = xa_begin[j]; k < xa_end[j]; k++)
		marker[asub[k]] = jcol;
    }
    return i;
}